

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerSafe::GetPendingDataset::anon_class_48_3_e6543253::operator()
          (anon_class_48_3_e6543253 *this)

{
  element_type *peVar1;
  function<void_(const_ot::commissioner::PendingOperationalDataset_*,_ot::commissioner::Error)>
  local_30;
  anon_class_48_3_e6543253 *local_10;
  anon_class_48_3_e6543253 *this_local;
  
  local_10 = this;
  peVar1 = std::
           __shared_ptr_access<ot::commissioner::CommissionerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::CommissionerImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->this->mImpl);
  std::function<void_(const_ot::commissioner::PendingOperationalDataset_*,_ot::commissioner::Error)>
  ::function(&local_30,&this->aHandler);
  (*(peVar1->super_Commissioner)._vptr_Commissioner[0x1f])
            (peVar1,&local_30,(ulong)this->aDatasetFlags);
  std::function<void_(const_ot::commissioner::PendingOperationalDataset_*,_ot::commissioner::Error)>
  ::~function(&local_30);
  return;
}

Assistant:

Error CommissionerSafe::GetPendingDataset(PendingOperationalDataset &aDataset, uint16_t aDatasetFlags)
{
    std::promise<Error> pro;
    auto                wait = [&pro, &aDataset](const PendingOperationalDataset *dataset, Error error) {
        if (dataset != nullptr)
        {
            aDataset = *dataset;
        }
        pro.set_value(error);
    };

    GetPendingDataset(wait, aDatasetFlags);
    return pro.get_future().get();
}